

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

void secp256k1_musig_ge_serialize_ext(uchar *out33,secp256k1_ge *ge)

{
  uchar *puStack_8;
  
  if (ge->infinity != 0) {
    out33[0x10] = '\0';
    out33[0x11] = '\0';
    out33[0x12] = '\0';
    out33[0x13] = '\0';
    out33[0x14] = '\0';
    out33[0x15] = '\0';
    out33[0x16] = '\0';
    out33[0x17] = '\0';
    out33[0x18] = '\0';
    out33[0x19] = '\0';
    out33[0x1a] = '\0';
    out33[0x1b] = '\0';
    out33[0x1c] = '\0';
    out33[0x1d] = '\0';
    out33[0x1e] = '\0';
    out33[0x1f] = '\0';
    out33[0] = '\0';
    out33[1] = '\0';
    out33[2] = '\0';
    out33[3] = '\0';
    out33[4] = '\0';
    out33[5] = '\0';
    out33[6] = '\0';
    out33[7] = '\0';
    out33[8] = '\0';
    out33[9] = '\0';
    out33[10] = '\0';
    out33[0xb] = '\0';
    out33[0xc] = '\0';
    out33[0xd] = '\0';
    out33[0xe] = '\0';
    out33[0xf] = '\0';
    out33[0x20] = '\0';
    return;
  }
  puStack_8 = out33;
  secp256k1_eckey_pubkey_serialize(ge,out33,(size_t *)&puStack_8,1);
  return;
}

Assistant:

static void secp256k1_musig_ge_serialize_ext(unsigned char *out33, secp256k1_ge* ge) {
    if (secp256k1_ge_is_infinity(ge)) {
        memset(out33, 0, 33);
    } else {
        int ret;
        size_t size = 33;
        ret = secp256k1_eckey_pubkey_serialize(ge, out33, &size, 1);
#ifdef VERIFY
        /* Serialize must succeed because the point is not at infinity */
        VERIFY_CHECK(ret && size == 33);
#else
        (void) ret;
#endif
    }
}